

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O0

void ucnv_extContinueMatchFromU_63
               (UConverter *cnv,UConverterFromUnicodeArgs *pArgs,int32_t srcIndex,
               UErrorCode *pErrorCode)

{
  int32_t iVar1;
  int iVar2;
  int count;
  int local_44;
  UChar *pUStack_40;
  int32_t j;
  UChar *s;
  int32_t length;
  int32_t match;
  uint32_t value;
  UErrorCode *pErrorCode_local;
  UConverterFromUnicodeArgs *pUStack_18;
  int32_t srcIndex_local;
  UConverterFromUnicodeArgs *pArgs_local;
  UConverter *cnv_local;
  
  length = 0;
  _match = pErrorCode;
  pErrorCode_local._4_4_ = srcIndex;
  pUStack_18 = pArgs;
  pArgs_local = (UConverterFromUnicodeArgs *)cnv;
  iVar1 = ucnv_extMatchFromU((cnv->sharedData->mbcs).extIndexes,cnv->preFromUFirstCP,cnv->preFromU,
                             (int)cnv->preFromULength,pArgs->source,
                             (int32_t)((long)pArgs->sourceLimit - (long)pArgs->source >> 1),
                             (uint32_t *)&length,cnv->useFallback,pArgs->flush);
  if (iVar1 < 2) {
    if (iVar1 < 0) {
      pUStack_40 = pUStack_18->source;
      for (local_44 = (int)*(char *)((long)&pArgs_local[5].size + 1); local_44 < -2 - iVar1;
          local_44 = local_44 + 1) {
        *(UChar *)((long)&pArgs_local[3].targetLimit + (long)local_44 * 2 + 4) = *pUStack_40;
        pUStack_40 = pUStack_40 + 1;
      }
      pUStack_18->source = pUStack_40;
      *(char *)((long)&pArgs_local[5].size + 1) = (char)(-2 - iVar1);
    }
    else {
      if (iVar1 == 1) {
        *(undefined1 *)((long)&pArgs_local[1].target + 7) = 1;
      }
      *(undefined4 *)((long)&pArgs_local[1].sourceLimit + 4) =
           *(undefined4 *)&pArgs_local[3].targetLimit;
      *(undefined4 *)&pArgs_local[3].targetLimit = 0xffffffff;
      *(char *)((long)&pArgs_local[5].size + 1) = -*(char *)((long)&pArgs_local[5].size + 1);
      *_match = U_INVALID_CHAR_FOUND;
    }
  }
  else {
    iVar2 = iVar1 + -2;
    if (iVar2 < *(char *)((long)&pArgs_local[5].size + 1)) {
      count = *(char *)((long)&pArgs_local[5].size + 1) - iVar2;
      u_memmove_63((UChar *)((long)&pArgs_local[3].targetLimit + 4),
                   (UChar *)((long)&pArgs_local[3].targetLimit + (long)iVar2 * 2 + 4),count);
      *(char *)((long)&pArgs_local[5].size + 1) = -(char)count;
    }
    else {
      pUStack_18->source = pUStack_18->source + (iVar2 - *(char *)((long)&pArgs_local[5].size + 1));
      *(undefined1 *)((long)&pArgs_local[5].size + 1) = 0;
    }
    *(undefined4 *)&pArgs_local[3].targetLimit = 0xffffffff;
    ucnv_extWriteFromU((UConverter *)pArgs_local,*(int32_t **)(pArgs_local->offsets + 0x48),length,
                       &pUStack_18->target,pUStack_18->targetLimit,&pUStack_18->offsets,
                       pErrorCode_local._4_4_,_match);
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_extContinueMatchFromU(UConverter *cnv,
                           UConverterFromUnicodeArgs *pArgs, int32_t srcIndex,
                           UErrorCode *pErrorCode) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match;

    match=ucnv_extMatchFromU(cnv->sharedData->mbcs.extIndexes,
                             cnv->preFromUFirstCP,
                             cnv->preFromU, cnv->preFromULength,
                             pArgs->source, (int32_t)(pArgs->sourceLimit-pArgs->source),
                             &value,
                             cnv->useFallback, pArgs->flush);
    if(match>=2) {
        match-=2; /* remove 2 for the initial code point */

        if(match>=cnv->preFromULength) {
            /* advance src pointer for the consumed input */
            pArgs->source+=match-cnv->preFromULength;
            cnv->preFromULength=0;
        } else {
            /* the match did not use all of preFromU[] - keep the rest for replay */
            int32_t length=cnv->preFromULength-match;
            u_memmove(cnv->preFromU, cnv->preFromU+match, length);
            cnv->preFromULength=(int8_t)-length;
        }

        /* finish the partial match */
        cnv->preFromUFirstCP=U_SENTINEL;

        /* write result */
        ucnv_extWriteFromU(cnv, cnv->sharedData->mbcs.extIndexes,
                           value,
                           &pArgs->target, pArgs->targetLimit,
                           &pArgs->offsets, srcIndex,
                           pErrorCode);
    } else if(match<0) {
        /* save state for partial match */
        const UChar *s;
        int32_t j;

        /* just _append_ the newly consumed input to preFromU[] */
        s=pArgs->source;
        match=-match-2; /* remove 2 for the initial code point */
        for(j=cnv->preFromULength; j<match; ++j) {
            U_ASSERT(j>=0);
            cnv->preFromU[j]=*s++;
        }
        pArgs->source=s; /* same as *src=srcLimit; because we reached the end of input */
        cnv->preFromULength=(int8_t)match;
    } else /* match==0 or 1 */ {
        /*
         * no match
         *
         * We need to split the previous input into two parts:
         *
         * 1. The first code point is unmappable - that's how we got into
         *    trying the extension data in the first place.
         *    We need to move it from the preFromU buffer
         *    to the error buffer, set an error code,
         *    and prepare the rest of the previous input for 2.
         *
         * 2. The rest of the previous input must be converted once we
         *    come back from the callback for the first code point.
         *    At that time, we have to try again from scratch to convert
         *    these input characters.
         *    The replay will be handled by the ucnv.c conversion code.
         */

        if(match==1) {
            /* matched, no mapping but request for <subchar1> */
            cnv->useSubChar1=TRUE;
        }

        /* move the first code point to the error field */
        cnv->fromUChar32=cnv->preFromUFirstCP;
        cnv->preFromUFirstCP=U_SENTINEL;

        /* mark preFromU for replay */
        cnv->preFromULength=-cnv->preFromULength;

        /* set the error code for unassigned */
        *pErrorCode=U_INVALID_CHAR_FOUND;
    }
}